

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

IdxT partition(lua_State *L,IdxT lo,IdxT up)

{
  int iVar1;
  uint local_20;
  uint local_1c;
  IdxT j;
  IdxT i;
  IdxT up_local;
  IdxT lo_local;
  lua_State *L_local;
  
  local_20 = up - 1;
  local_1c = lo;
  while( true ) {
    while( true ) {
      local_1c = local_1c + 1;
      lua_geti(L,1,(ulong)local_1c);
      iVar1 = sort_comp(L,-1,-2);
      if (iVar1 == 0) break;
      if (local_1c == up - 1) {
        luaL_error(L,"invalid order function for sorting");
      }
      lua_settop(L,-2);
    }
    while( true ) {
      local_20 = local_20 - 1;
      lua_geti(L,1,(ulong)local_20);
      iVar1 = sort_comp(L,-3,-1);
      if (iVar1 == 0) break;
      if (local_20 < local_1c) {
        luaL_error(L,"invalid order function for sorting");
      }
      lua_settop(L,-2);
    }
    if (local_20 < local_1c) break;
    set2(L,local_1c,local_20);
  }
  lua_settop(L,-2);
  set2(L,up - 1,local_1c);
  return local_1c;
}

Assistant:

static IdxT partition (lua_State *L, IdxT lo, IdxT up) {
  IdxT i = lo;  /* will be incremented before first use */
  IdxT j = up - 1;  /* will be decremented before first use */
  /* loop invariant: a[lo .. i] <= P <= a[j .. up] */
  for (;;) {
    /* next loop: repeat ++i while a[i] < P */
    while (lua_geti(L, 1, ++i), sort_comp(L, -1, -2)) {
      if (i == up - 1)  /* a[i] < P  but a[up - 1] == P  ?? */
        luaL_error(L, "invalid order function for sorting");
      lua_pop(L, 1);  /* remove a[i] */
    }
    /* after the loop, a[i] >= P and a[lo .. i - 1] < P */
    /* next loop: repeat --j while P < a[j] */
    while (lua_geti(L, 1, --j), sort_comp(L, -3, -1)) {
      if (j < i)  /* j < i  but  a[j] > P ?? */
        luaL_error(L, "invalid order function for sorting");
      lua_pop(L, 1);  /* remove a[j] */
    }
    /* after the loop, a[j] <= P and a[j + 1 .. up] >= P */
    if (j < i) {  /* no elements out of place? */
      /* a[lo .. i - 1] <= P <= a[j + 1 .. i .. up] */
      lua_pop(L, 1);  /* pop a[j] */
      /* swap pivot (a[up - 1]) with a[i] to satisfy pos-condition */
      set2(L, up - 1, i);
      return i;
    }
    /* otherwise, swap a[i] - a[j] to restore invariant and repeat */
    set2(L, i, j);
  }
}